

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveEntityReliablePdu.cpp
# Opt level: O2

void __thiscall DIS::RemoveEntityReliablePdu::RemoveEntityReliablePdu(RemoveEntityReliablePdu *this)

{
  SimulationManagementWithReliabilityFamilyPdu::SimulationManagementWithReliabilityFamilyPdu
            (&this->super_SimulationManagementWithReliabilityFamilyPdu);
  (this->super_SimulationManagementWithReliabilityFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__RemoveEntityReliablePdu_001b1e10;
  this->_requiredReliabilityService = '\0';
  this->_pad1 = 0;
  this->_pad2 = '\0';
  this->_requestID = 0;
  Pdu::setPduType((Pdu *)this,'4');
  return;
}

Assistant:

RemoveEntityReliablePdu::RemoveEntityReliablePdu() : SimulationManagementWithReliabilityFamilyPdu(),
   _requiredReliabilityService(0), 
   _pad1(0), 
   _pad2(0), 
   _requestID(0)
{
    setPduType( 52 );
}